

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomConnections::read(DomConnections *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomConnection *this_00;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView other;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QArrayDataPointer<char16_t> local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)CONCAT44(in_register_00000034,__fd));
      if (bVar1) goto LAB_0014d995;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_48.m_size = -0x5555555555555556;
      local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_48 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"connection",10);
      __nbytes_00 = 0;
      other.m_data = local_60.ptr;
      other.m_size = local_60.size;
      iVar2 = QStringView::compare(&local_48,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      if (iVar2 == 0) {
        this_00 = (DomConnection *)operator_new(0x70);
        *(undefined8 *)this_00 = 0;
        (this_00->m_sender).d.d = (Data *)0x0;
        (this_00->m_sender).d.ptr = (char16_t *)0x0;
        (this_00->m_sender).d.size = 0;
        (this_00->m_signal).d.d = (Data *)0x0;
        (this_00->m_signal).d.ptr = (char16_t *)0x0;
        (this_00->m_signal).d.size = 0;
        (this_00->m_receiver).d.d = (Data *)0x0;
        (this_00->m_receiver).d.ptr = (char16_t *)0x0;
        (this_00->m_receiver).d.size = 0;
        (this_00->m_slot).d.d = (Data *)0x0;
        (this_00->m_slot).d.ptr = (char16_t *)0x0;
        (this_00->m_slot).d.size = 0;
        this_00->m_hints = (DomConnectionHints *)0x0;
        DomConnection::read(this_00,__fd,__buf_00,__nbytes_00);
        QList<DomConnection_*>::append(&this->m_connection,this_00);
      }
      else {
        local_78.a.m_size = 0x13;
        local_78.a.m_data = "Unexpected element ";
        local_78.b = &local_48;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_60,&local_78);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      }
    }
  } while (iVar2 != 5);
LAB_0014d995:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnections::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"connection"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnection();
                v->read(reader);
                m_connection.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}